

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::configure(Logger *this,Configurations *configurations)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TypedConfigurations *this_00;
  NoScopedLock<el::base::threading::internal::NoMutex> local_28;
  ScopedLock scopedLock;
  Configurations *c;
  Configurations *configurations_local;
  Logger *this_local;
  
  this->m_isConfigured = false;
  initUnflushedCount(this);
  if (this->m_typedConfigurations != (TypedConfigurations *)0x0) {
    scopedLock._vptr_NoScopedLock =
         (_func_int **)el::base::TypedConfigurations::configurations(this->m_typedConfigurations);
    bVar1 = Configurations::hasConfiguration
                      ((Configurations *)scopedLock._vptr_NoScopedLock,Global,Filename);
    if (bVar1) {
      flush(this);
    }
  }
  iVar2 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            (&local_28,(NoMutex *)CONCAT44(extraout_var,iVar2));
  bVar1 = el::base::utils::
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          ::operator!=((AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)&this->m_configurations,
                       (AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)configurations);
  if (bVar1) {
    Configurations::setFromBase(&this->m_configurations,configurations);
  }
  el::base::utils::safeDelete<el::base::TypedConfigurations>(&this->m_typedConfigurations);
  this_00 = (TypedConfigurations *)operator_new(0x200);
  el::base::TypedConfigurations::TypedConfigurations
            (this_00,&this->m_configurations,this->m_logStreamsReference);
  this->m_typedConfigurations = this_00;
  resolveLoggerFormatSpec(this);
  this->m_isConfigured = true;
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_28);
  return;
}

Assistant:

void Logger::configure(const Configurations& configurations) {
  m_isConfigured = false;  // we set it to false in case if we fail
  initUnflushedCount();
  if (m_typedConfigurations != nullptr) {
    Configurations* c = const_cast<Configurations*>(m_typedConfigurations->configurations());
    if (c->hasConfiguration(Level::Global, ConfigurationType::Filename)) {
      // This check is definitely needed for cases like ELPP_NO_DEFAULT_LOG_FILE
      flush();
    }
  }
  base::threading::ScopedLock scopedLock(lock());
  if (m_configurations != configurations) {
    m_configurations.setFromBase(const_cast<Configurations*>(&configurations));
  }
  base::utils::safeDelete(m_typedConfigurations);
  m_typedConfigurations = new base::TypedConfigurations(&m_configurations, m_logStreamsReference);
  resolveLoggerFormatSpec();
  m_isConfigured = true;
}